

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O3

AST * parse_finish_labeled_statement(Translation_Data *translation_data,Scope *scope,AST_Type type)

{
  char cVar1;
  token *label;
  AST_Labeled_Statement *error;
  AST *pAVar2;
  AST_Error *pAVar3;
  
  cVar1 = check(translation_data,KW_ID,0);
  if (cVar1 == '\0') {
    push_translation_error(" label expected in labeled statement",translation_data);
    error = (AST_Labeled_Statement *)0x0;
  }
  else {
    label = (token *)Queue_Pop(translation_data->tokens);
    error = get_labeled_statement_tree(label,(AST *)0x0,type);
    cVar1 = get_and_check(translation_data,KW_COLUMN);
    if (cVar1 != '\0') {
      pAVar2 = parse_statement(translation_data,scope);
      error->statement = pAVar2;
      return (AST *)error;
    }
    push_translation_error(" \':\' expected in labeled statement",translation_data);
  }
  pAVar3 = get_error_tree((AST *)error);
  return (AST *)pAVar3;
}

Assistant:

struct AST* parse_finish_labeled_statement(struct Translation_Data* translation_data,struct Scope *scope,enum AST_Type type)
{
	struct AST_Labeled_Statement *ret;
	if(check(translation_data,KW_ID,0))
	{
		ret=get_labeled_statement_tree(Queue_Pop(translation_data->tokens),NULL,type);
		if(get_and_check(translation_data,KW_COLUMN))
		{
			ret->statement=parse_statement(translation_data,scope);
			return (struct AST*)ret;
		}else
		{
			push_translation_error(" ':' expected in labeled statement",translation_data);
			return (struct AST*)get_error_tree((struct AST*)ret);
		}
	}else
	{
		push_translation_error(" label expected in labeled statement",translation_data);
		return (struct AST*)get_error_tree(NULL);
	}
}